

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontAtlas::ClearTexData(ImFontAtlas *this)

{
  int *piVar1;
  uchar *puVar2;
  uint *puVar3;
  ImGuiContext *pIVar4;
  
  pIVar4 = GImGui;
  puVar2 = this->TexPixelsAlpha8;
  if (puVar2 != (uchar *)0x0) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar4->IO).MemFreeFn)(puVar2);
  }
  pIVar4 = GImGui;
  puVar3 = this->TexPixelsRGBA32;
  if (puVar3 != (uint *)0x0) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar4->IO).MemFreeFn)(puVar3);
  }
  this->TexPixelsAlpha8 = (uchar *)0x0;
  this->TexPixelsRGBA32 = (uint *)0x0;
  return;
}

Assistant:

void    ImFontAtlas::ClearTexData()
{
    if (TexPixelsAlpha8)
        ImGui::MemFree(TexPixelsAlpha8);
    if (TexPixelsRGBA32)
        ImGui::MemFree(TexPixelsRGBA32);
    TexPixelsAlpha8 = NULL;
    TexPixelsRGBA32 = NULL;
}